

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

int64_t tar_atol(char *p,size_t char_cnt)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int64_t iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  
  bVar1 = *p;
  if (-1 < (char)bVar1) {
    iVar4 = tar_atol_base_n(p,char_cnt,L'\b');
    return iVar4;
  }
  bVar3 = bVar1 >> 6 & 1;
  uVar5 = -(ulong)bVar3;
  bVar2 = bVar1 & 0x3f;
  if (bVar3 != 0) {
    bVar2 = bVar1;
  }
  uVar7 = (ulong)bVar2;
  uVar8 = 0xff;
  if (bVar3 == 0) {
    uVar8 = 0;
  }
  while( true ) {
    if (char_cnt < 9) break;
    if (uVar8 != (uint)uVar7) goto LAB_004c702a;
    char_cnt = char_cnt - 1;
    uVar7 = (ulong)((byte *)p)[1];
    p = (char *)((byte *)p + 1);
  }
  if ((uVar8 ^ (uint)uVar7) < 0x80) {
    for (lVar6 = 1; uVar5 = uVar7 | uVar5 << 8, lVar6 != 8; lVar6 = lVar6 + 1) {
      uVar7 = (ulong)((byte *)p)[lVar6];
    }
  }
  else {
LAB_004c702a:
    uVar5 = 0x8000000000000000;
    if ((bVar1 & 0x40) == 0) {
      uVar5 = 0x7fffffffffffffff;
    }
  }
  return uVar5;
}

Assistant:

static int64_t
tar_atol(const char *p, size_t char_cnt)
{
	/*
	 * Technically, GNU tar considers a field to be in base-256
	 * only if the first byte is 0xff or 0x80.
	 */
	if (*p & 0x80)
		return (tar_atol256(p, char_cnt));
	return (tar_atol8(p, char_cnt));
}